

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::RepeatGreedyLoopNoBacktrackInst::Exec
          (RepeatGreedyLoopNoBacktrackInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  BeginGreedyLoopNoBacktrackInst *pBVar3;
  LoopInfo *pLVar4;
  Cont *pCVar5;
  undefined4 *puVar6;
  uint8 *puVar7;
  ResumeCont *resume;
  Cont *top;
  LoopInfo *loopInfo;
  BeginGreedyLoopNoBacktrackInst *begin;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  RepeatGreedyLoopNoBacktrackInst *this_local;
  
  pBVar3 = Matcher::LabelToInstPointer<UnifiedRegex::BeginGreedyLoopNoBacktrackInst>
                     (matcher,BeginGreedyLoopNoBacktrack,(this->super_RepeatLoopMixin).beginLabel);
  pLVar4 = Matcher::LoopIdToLoopInfo(matcher,(pBVar3->super_GreedyLoopNoBacktrackMixin).loopId);
  pLVar4->number = pLVar4->number + 1;
  if (*inputOffset == pLVar4->startInputOffset) {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    pCVar5 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    if ((pCVar5 == (Cont *)0x0) || (pCVar5->tag != Resume)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xe9c,"(top != 0 && top->tag == Cont::ContTag::Resume)",
                         "top != 0 && top->tag == Cont::ContTag::Resume");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    *(CharCount *)&pCVar5->field_0xc = *inputOffset;
    pLVar4->startInputOffset = *inputOffset;
    puVar7 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 9);
    *instPointer = puVar7;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool RepeatGreedyLoopNoBacktrackInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginGreedyLoopNoBacktrackInst* begin = matcher.L2I(BeginGreedyLoopNoBacktrack, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (inputOffset == loopInfo->startInputOffset)
        {
            // No progress
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack, continue from here with no more iterations.
            // Since the loop body is deterministic and group free, it wouldn't have left any continuation records.
            // Therefore we can simply update the Resume continuation still on the top of the stack with the current
            // input pointer.
            Cont* top = contStack.Top();
            Assert(top != 0 && top->tag == Cont::ContTag::Resume);
            ResumeCont* resume = (ResumeCont*)top;
            resume->origInputOffset = inputOffset;

            loopInfo->startInputOffset = inputOffset;
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginGreedyLoopNoBacktrackInst));
        }
        return false;
    }